

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void build_quoted_str(char *dstbuf,char *src,wchar_t qu)

{
  wchar_t wVar1;
  wchar_t in_EDX;
  char *in_RSI;
  char *in_RDI;
  wchar_t ch;
  utf8_ptr dst;
  utf8_ptr p;
  wchar_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  wchar_t in_stack_ffffffffffffffd4;
  utf8_ptr local_28;
  utf8_ptr local_20;
  wchar_t local_14;
  char *local_10;
  char *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  utf8_ptr::utf8_ptr(&local_20);
  utf8_ptr::utf8_ptr(&local_28);
  utf8_ptr::set(&local_20,local_10);
  utf8_ptr::set(&local_28,local_8);
  utf8_ptr::setch((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc);
  while( true ) {
    wVar1 = utf8_ptr::getch((utf8_ptr *)0x2eff9c);
    if (wVar1 == L'\0') break;
    in_stack_ffffffffffffffd4 = utf8_ptr::getch((utf8_ptr *)0x2effab);
    if ((in_stack_ffffffffffffffd4 == L'\\') || (in_stack_ffffffffffffffd4 == local_14)) {
      utf8_ptr::setch((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
    }
    utf8_ptr::setch((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffcc);
    utf8_ptr::inc((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  utf8_ptr::setch((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc);
  utf8_ptr::setch((utf8_ptr *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffcc);
  return;
}

Assistant:

static void build_quoted_str(char *dstbuf, const char *src, wchar_t qu)
{
    utf8_ptr p;
    utf8_ptr dst;

    /* scan the source string for escapable characters */
    for (p.set((char *)src), dst.set(dstbuf), dst.setch(qu) ;
         p.getch() != '\0' ; p.inc())
    {
        wchar_t ch;

        /* get this source character */
        ch = p.getch();

        /* add a quote if we have a backslash or the quote character */
        if (ch == '\\' || ch == qu)
        {
            /* add a backslash to escape the character */
            dst.setch('\\');
        }

        /* add the character */
        dst.setch(ch);
    }

    /* add the close quote and trailing null */
    dst.setch(qu);
    dst.setch('\0');
}